

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  char cVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar44;
  uint uVar45;
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar46;
  undefined1 auVar43 [16];
  float fVar47;
  float fVar52;
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [16];
  float fVar72;
  undefined1 auVar69 [16];
  vint4 bi_1;
  vint4 ai;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai_3;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  vint4 ai_1;
  float fVar80;
  float fVar81;
  float fVar83;
  float fVar84;
  undefined1 auVar82 [16];
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  undefined1 auVar87 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar13 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar14 = (tray->tnear).field_0.i[k];
  iVar15 = (tray->tfar).field_0.i[k];
  puVar29 = local_7d0;
LAB_007225d3:
  puVar28 = puVar29;
  if (puVar28 == &local_7d8) {
LAB_00722af8:
    return puVar28 != &local_7d8;
  }
  puVar29 = puVar28 + -1;
  uVar30 = puVar28[-1];
  do {
    fVar16 = *(float *)(ray + k * 4 + 0x70);
    fVar32 = 1.0 - fVar16;
    fVar33 = fVar32 * 0.0;
    do {
      if ((uVar30 & 8) != 0) {
        cVar22 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar30 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar22 == '\0') goto LAB_007225d3;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_00722af8;
      }
      uVar24 = (uint)uVar30 & 7;
      uVar23 = uVar30 & 0xfffffffffffffff0;
      if (uVar24 == 3) {
        auVar82._0_4_ =
             fVar8 * *(float *)(uVar23 + 0x20) +
             fVar9 * *(float *)(uVar23 + 0x50) + fVar10 * *(float *)(uVar23 + 0x80);
        auVar82._4_4_ =
             fVar8 * *(float *)(uVar23 + 0x24) +
             fVar9 * *(float *)(uVar23 + 0x54) + fVar10 * *(float *)(uVar23 + 0x84);
        auVar82._8_4_ =
             fVar8 * *(float *)(uVar23 + 0x28) +
             fVar9 * *(float *)(uVar23 + 0x58) + fVar10 * *(float *)(uVar23 + 0x88);
        auVar82._12_4_ =
             fVar8 * *(float *)(uVar23 + 0x2c) +
             fVar9 * *(float *)(uVar23 + 0x5c) + fVar10 * *(float *)(uVar23 + 0x8c);
        auVar87._0_4_ =
             fVar8 * *(float *)(uVar23 + 0x30) +
             fVar9 * *(float *)(uVar23 + 0x60) + fVar10 * *(float *)(uVar23 + 0x90);
        auVar87._4_4_ =
             fVar8 * *(float *)(uVar23 + 0x34) +
             fVar9 * *(float *)(uVar23 + 100) + fVar10 * *(float *)(uVar23 + 0x94);
        auVar87._8_4_ =
             fVar8 * *(float *)(uVar23 + 0x38) +
             fVar9 * *(float *)(uVar23 + 0x68) + fVar10 * *(float *)(uVar23 + 0x98);
        auVar87._12_4_ =
             fVar8 * *(float *)(uVar23 + 0x3c) +
             fVar9 * *(float *)(uVar23 + 0x6c) + fVar10 * *(float *)(uVar23 + 0x9c);
        auVar91._0_4_ =
             fVar8 * *(float *)(uVar23 + 0x40) +
             fVar9 * *(float *)(uVar23 + 0x70) + fVar10 * *(float *)(uVar23 + 0xa0);
        auVar91._4_4_ =
             fVar8 * *(float *)(uVar23 + 0x44) +
             fVar9 * *(float *)(uVar23 + 0x74) + fVar10 * *(float *)(uVar23 + 0xa4);
        auVar91._8_4_ =
             fVar8 * *(float *)(uVar23 + 0x48) +
             fVar9 * *(float *)(uVar23 + 0x78) + fVar10 * *(float *)(uVar23 + 0xa8);
        auVar91._12_4_ =
             fVar8 * *(float *)(uVar23 + 0x4c) +
             fVar9 * *(float *)(uVar23 + 0x7c) + fVar10 * *(float *)(uVar23 + 0xac);
        uVar39 = (uint)DAT_01f46710;
        uVar44 = DAT_01f46710._4_4_;
        uVar45 = DAT_01f46710._8_4_;
        uVar46 = DAT_01f46710._12_4_;
        fVar47 = (float)DAT_01f4bd50;
        fVar52 = DAT_01f4bd50._4_4_;
        fVar53 = DAT_01f4bd50._8_4_;
        fVar54 = DAT_01f4bd50._12_4_;
        auVar92._4_4_ = -(uint)((float)((uint)auVar82._4_4_ & uVar44) < fVar52);
        auVar92._0_4_ = -(uint)((float)((uint)auVar82._0_4_ & uVar39) < fVar47);
        auVar92._8_4_ = -(uint)((float)((uint)auVar82._8_4_ & uVar45) < fVar53);
        auVar92._12_4_ = -(uint)((float)((uint)auVar82._12_4_ & uVar46) < fVar54);
        auVar42 = blendvps(auVar82,_DAT_01f4bd50,auVar92);
        auVar36._4_4_ = -(uint)((float)((uint)auVar87._4_4_ & uVar44) < fVar52);
        auVar36._0_4_ = -(uint)((float)((uint)auVar87._0_4_ & uVar39) < fVar47);
        auVar36._8_4_ = -(uint)((float)((uint)auVar87._8_4_ & uVar45) < fVar53);
        auVar36._12_4_ = -(uint)((float)((uint)auVar87._12_4_ & uVar46) < fVar54);
        auVar59 = blendvps(auVar87,_DAT_01f4bd50,auVar36);
        auVar37._4_4_ = -(uint)((float)((uint)auVar91._4_4_ & uVar44) < fVar52);
        auVar37._0_4_ = -(uint)((float)((uint)auVar91._0_4_ & uVar39) < fVar47);
        auVar37._8_4_ = -(uint)((float)((uint)auVar91._8_4_ & uVar45) < fVar53);
        auVar37._12_4_ = -(uint)((float)((uint)auVar91._12_4_ & uVar46) < fVar54);
        auVar92 = blendvps(auVar91,_DAT_01f4bd50,auVar37);
        auVar49 = rcpps(_DAT_01f46710,auVar42);
        fVar47 = auVar49._0_4_;
        fVar52 = auVar49._4_4_;
        fVar53 = auVar49._8_4_;
        fVar54 = auVar49._12_4_;
        fVar47 = (1.0 - auVar42._0_4_ * fVar47) * fVar47 + fVar47;
        fVar52 = (1.0 - auVar42._4_4_ * fVar52) * fVar52 + fVar52;
        fVar53 = (1.0 - auVar42._8_4_ * fVar53) * fVar53 + fVar53;
        fVar54 = (1.0 - auVar42._12_4_ * fVar54) * fVar54 + fVar54;
        auVar49 = rcpps(auVar49,auVar59);
        fVar81 = auVar49._0_4_;
        fVar83 = auVar49._4_4_;
        fVar84 = auVar49._8_4_;
        fVar85 = auVar49._12_4_;
        fVar81 = (1.0 - auVar59._0_4_ * fVar81) * fVar81 + fVar81;
        fVar83 = (1.0 - auVar59._4_4_ * fVar83) * fVar83 + fVar83;
        fVar84 = (1.0 - auVar59._8_4_ * fVar84) * fVar84 + fVar84;
        fVar85 = (1.0 - auVar59._12_4_ * fVar85) * fVar85 + fVar85;
        auVar49 = rcpps(auVar49,auVar92);
        fVar86 = auVar49._0_4_;
        fVar88 = auVar49._4_4_;
        fVar89 = auVar49._8_4_;
        fVar90 = auVar49._12_4_;
        fVar86 = (1.0 - auVar92._0_4_ * fVar86) * fVar86 + fVar86;
        fVar88 = (1.0 - auVar92._4_4_ * fVar88) * fVar88 + fVar88;
        fVar89 = (1.0 - auVar92._8_4_ * fVar89) * fVar89 + fVar89;
        fVar90 = (1.0 - auVar92._12_4_ * fVar90) * fVar90 + fVar90;
        fVar67 = *(float *)(uVar23 + 0x20) * fVar5 +
                 *(float *)(uVar23 + 0x50) * fVar6 +
                 *(float *)(uVar23 + 0x80) * fVar7 + *(float *)(uVar23 + 0xb0);
        fVar70 = *(float *)(uVar23 + 0x24) * fVar5 +
                 *(float *)(uVar23 + 0x54) * fVar6 +
                 *(float *)(uVar23 + 0x84) * fVar7 + *(float *)(uVar23 + 0xb4);
        fVar71 = *(float *)(uVar23 + 0x28) * fVar5 +
                 *(float *)(uVar23 + 0x58) * fVar6 +
                 *(float *)(uVar23 + 0x88) * fVar7 + *(float *)(uVar23 + 0xb8);
        fVar72 = *(float *)(uVar23 + 0x2c) * fVar5 +
                 *(float *)(uVar23 + 0x5c) * fVar6 +
                 *(float *)(uVar23 + 0x8c) * fVar7 + *(float *)(uVar23 + 0xbc);
        fVar55 = *(float *)(uVar23 + 0x30) * fVar5 +
                 *(float *)(uVar23 + 0x60) * fVar6 +
                 *(float *)(uVar23 + 0x90) * fVar7 + *(float *)(uVar23 + 0xc0);
        fVar61 = *(float *)(uVar23 + 0x34) * fVar5 +
                 *(float *)(uVar23 + 100) * fVar6 +
                 *(float *)(uVar23 + 0x94) * fVar7 + *(float *)(uVar23 + 0xc4);
        fVar63 = *(float *)(uVar23 + 0x38) * fVar5 +
                 *(float *)(uVar23 + 0x68) * fVar6 +
                 *(float *)(uVar23 + 0x98) * fVar7 + *(float *)(uVar23 + 200);
        fVar65 = *(float *)(uVar23 + 0x3c) * fVar5 +
                 *(float *)(uVar23 + 0x6c) * fVar6 +
                 *(float *)(uVar23 + 0x9c) * fVar7 + *(float *)(uVar23 + 0xcc);
        fVar56 = *(float *)(uVar23 + 0x40) * fVar5 +
                 *(float *)(uVar23 + 0x70) * fVar6 +
                 *(float *)(uVar23 + 0xa0) * fVar7 + *(float *)(uVar23 + 0xd0);
        fVar62 = *(float *)(uVar23 + 0x44) * fVar5 +
                 *(float *)(uVar23 + 0x74) * fVar6 +
                 *(float *)(uVar23 + 0xa4) * fVar7 + *(float *)(uVar23 + 0xd4);
        fVar64 = *(float *)(uVar23 + 0x48) * fVar5 +
                 *(float *)(uVar23 + 0x78) * fVar6 +
                 *(float *)(uVar23 + 0xa8) * fVar7 + *(float *)(uVar23 + 0xd8);
        fVar66 = *(float *)(uVar23 + 0x4c) * fVar5 +
                 *(float *)(uVar23 + 0x7c) * fVar6 +
                 *(float *)(uVar23 + 0xac) * fVar7 + *(float *)(uVar23 + 0xdc);
        fVar77 = ((*(float *)(uVar23 + 0xe0) * fVar16 + fVar33) - fVar67) * fVar47;
        fVar78 = ((*(float *)(uVar23 + 0xe4) * fVar16 + fVar33) - fVar70) * fVar52;
        fVar79 = ((*(float *)(uVar23 + 0xe8) * fVar16 + fVar33) - fVar71) * fVar53;
        fVar80 = ((*(float *)(uVar23 + 0xec) * fVar16 + fVar33) - fVar72) * fVar54;
        fVar47 = ((*(float *)(uVar23 + 0x110) * fVar16 + fVar32) - fVar67) * fVar47;
        fVar52 = ((*(float *)(uVar23 + 0x114) * fVar16 + fVar32) - fVar70) * fVar52;
        fVar53 = ((*(float *)(uVar23 + 0x118) * fVar16 + fVar32) - fVar71) * fVar53;
        fVar54 = ((*(float *)(uVar23 + 0x11c) * fVar16 + fVar32) - fVar72) * fVar54;
        fVar73 = ((*(float *)(uVar23 + 0xf0) * fVar16 + fVar33) - fVar55) * fVar81;
        fVar74 = ((*(float *)(uVar23 + 0xf4) * fVar16 + fVar33) - fVar61) * fVar83;
        fVar75 = ((*(float *)(uVar23 + 0xf8) * fVar16 + fVar33) - fVar63) * fVar84;
        fVar76 = ((*(float *)(uVar23 + 0xfc) * fVar16 + fVar33) - fVar65) * fVar85;
        fVar67 = ((*(float *)(uVar23 + 0x100) * fVar16 + fVar33) - fVar56) * fVar86;
        fVar70 = ((*(float *)(uVar23 + 0x104) * fVar16 + fVar33) - fVar62) * fVar88;
        fVar71 = ((*(float *)(uVar23 + 0x108) * fVar16 + fVar33) - fVar64) * fVar89;
        fVar72 = ((*(float *)(uVar23 + 0x10c) * fVar16 + fVar33) - fVar66) * fVar90;
        fVar81 = ((*(float *)(uVar23 + 0x120) * fVar16 + fVar32) - fVar55) * fVar81;
        fVar83 = ((*(float *)(uVar23 + 0x124) * fVar16 + fVar32) - fVar61) * fVar83;
        fVar84 = ((*(float *)(uVar23 + 0x128) * fVar16 + fVar32) - fVar63) * fVar84;
        fVar85 = ((*(float *)(uVar23 + 300) * fVar16 + fVar32) - fVar65) * fVar85;
        fVar86 = ((*(float *)(uVar23 + 0x130) * fVar16 + fVar32) - fVar56) * fVar86;
        fVar88 = ((*(float *)(uVar23 + 0x134) * fVar16 + fVar32) - fVar62) * fVar88;
        fVar89 = ((*(float *)(uVar23 + 0x138) * fVar16 + fVar32) - fVar64) * fVar89;
        fVar90 = ((*(float *)(uVar23 + 0x13c) * fVar16 + fVar32) - fVar66) * fVar90;
        auVar38._0_4_ =
             (uint)((int)fVar81 < (int)fVar73) * (int)fVar81 |
             (uint)((int)fVar81 >= (int)fVar73) * (int)fVar73;
        auVar38._4_4_ =
             (uint)((int)fVar83 < (int)fVar74) * (int)fVar83 |
             (uint)((int)fVar83 >= (int)fVar74) * (int)fVar74;
        auVar38._8_4_ =
             (uint)((int)fVar84 < (int)fVar75) * (int)fVar84 |
             (uint)((int)fVar84 >= (int)fVar75) * (int)fVar75;
        auVar38._12_4_ =
             (uint)((int)fVar85 < (int)fVar76) * (int)fVar85 |
             (uint)((int)fVar85 >= (int)fVar76) * (int)fVar76;
        auVar50._0_4_ =
             (uint)((int)fVar86 < (int)fVar67) * (int)fVar86 |
             (uint)((int)fVar86 >= (int)fVar67) * (int)fVar67;
        auVar50._4_4_ =
             (uint)((int)fVar88 < (int)fVar70) * (int)fVar88 |
             (uint)((int)fVar88 >= (int)fVar70) * (int)fVar70;
        auVar50._8_4_ =
             (uint)((int)fVar89 < (int)fVar71) * (int)fVar89 |
             (uint)((int)fVar89 >= (int)fVar71) * (int)fVar71;
        auVar50._12_4_ =
             (uint)((int)fVar90 < (int)fVar72) * (int)fVar90 |
             (uint)((int)fVar90 >= (int)fVar72) * (int)fVar72;
        auVar49 = maxps(auVar38,auVar50);
        auVar51._0_4_ =
             (uint)((int)fVar47 < (int)fVar77) * (int)fVar47 |
             (uint)((int)fVar47 >= (int)fVar77) * (int)fVar77;
        auVar51._4_4_ =
             (uint)((int)fVar52 < (int)fVar78) * (int)fVar52 |
             (uint)((int)fVar52 >= (int)fVar78) * (int)fVar78;
        auVar51._8_4_ =
             (uint)((int)fVar53 < (int)fVar79) * (int)fVar53 |
             (uint)((int)fVar53 >= (int)fVar79) * (int)fVar79;
        auVar51._12_4_ =
             (uint)((int)fVar54 < (int)fVar80) * (int)fVar54 |
             (uint)((int)fVar54 >= (int)fVar80) * (int)fVar80;
        auVar42._4_4_ = iVar15;
        auVar42._0_4_ = iVar15;
        auVar42._8_4_ = iVar15;
        auVar42._12_4_ = iVar15;
        auVar69._0_4_ =
             (uint)((int)fVar81 < (int)fVar73) * (int)fVar73 |
             (uint)((int)fVar81 >= (int)fVar73) * (int)fVar81;
        auVar69._4_4_ =
             (uint)((int)fVar83 < (int)fVar74) * (int)fVar74 |
             (uint)((int)fVar83 >= (int)fVar74) * (int)fVar83;
        auVar69._8_4_ =
             (uint)((int)fVar84 < (int)fVar75) * (int)fVar75 |
             (uint)((int)fVar84 >= (int)fVar75) * (int)fVar84;
        auVar69._12_4_ =
             (uint)((int)fVar85 < (int)fVar76) * (int)fVar76 |
             (uint)((int)fVar85 >= (int)fVar76) * (int)fVar85;
        auVar59._4_4_ = iVar14;
        auVar59._0_4_ = iVar14;
        auVar59._8_4_ = iVar14;
        auVar59._12_4_ = iVar14;
        auVar43._0_4_ =
             (uint)((int)fVar86 < (int)fVar67) * (int)fVar67 |
             (uint)((int)fVar86 >= (int)fVar67) * (int)fVar86;
        auVar43._4_4_ =
             (uint)((int)fVar88 < (int)fVar70) * (int)fVar70 |
             (uint)((int)fVar88 >= (int)fVar70) * (int)fVar88;
        auVar43._8_4_ =
             (uint)((int)fVar89 < (int)fVar71) * (int)fVar71 |
             (uint)((int)fVar89 >= (int)fVar71) * (int)fVar89;
        auVar43._12_4_ =
             (uint)((int)fVar90 < (int)fVar72) * (int)fVar72 |
             (uint)((int)fVar90 >= (int)fVar72) * (int)fVar90;
        auVar92 = minps(auVar69,auVar43);
        auVar59 = maxps(auVar59,auVar51);
        auVar59 = maxps(auVar59,auVar49);
        auVar49._4_4_ =
             (uint)((int)fVar52 < (int)fVar78) * (int)fVar78 |
             (uint)((int)fVar52 >= (int)fVar78) * (int)fVar52;
        auVar49._0_4_ =
             (uint)((int)fVar47 < (int)fVar77) * (int)fVar77 |
             (uint)((int)fVar47 >= (int)fVar77) * (int)fVar47;
        auVar49._8_4_ =
             (uint)((int)fVar53 < (int)fVar79) * (int)fVar79 |
             (uint)((int)fVar53 >= (int)fVar79) * (int)fVar53;
        auVar49._12_4_ =
             (uint)((int)fVar54 < (int)fVar80) * (int)fVar80 |
             (uint)((int)fVar54 >= (int)fVar80) * (int)fVar54;
        auVar49 = minps(auVar42,auVar49);
        auVar49 = minps(auVar49,auVar92);
LAB_007226fb:
        bVar18 = auVar59._0_4_ <= auVar49._0_4_;
        bVar19 = auVar59._4_4_ <= auVar49._4_4_;
        bVar20 = auVar59._8_4_ <= auVar49._8_4_;
        bVar21 = auVar59._12_4_ <= auVar49._12_4_;
      }
      else {
        pfVar3 = (float *)(uVar23 + 0x80 + uVar26);
        pfVar1 = (float *)(uVar23 + 0x20 + uVar26);
        pfVar4 = (float *)(uVar23 + 0x80 + uVar31);
        pfVar2 = (float *)(uVar23 + 0x20 + uVar31);
        auVar34._0_4_ = ((*pfVar3 * fVar16 + *pfVar1) - fVar5) * fVar11;
        auVar34._4_4_ = ((pfVar3[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
        auVar34._8_4_ = ((pfVar3[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
        auVar34._12_4_ = ((pfVar3[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
        auVar48._0_4_ = ((*pfVar4 * fVar16 + *pfVar2) - fVar6) * fVar12;
        auVar48._4_4_ = ((pfVar4[1] * fVar16 + pfVar2[1]) - fVar6) * fVar12;
        auVar48._8_4_ = ((pfVar4[2] * fVar16 + pfVar2[2]) - fVar6) * fVar12;
        auVar48._12_4_ = ((pfVar4[3] * fVar16 + pfVar2[3]) - fVar6) * fVar12;
        pfVar2 = (float *)(uVar23 + 0x80 + uVar27);
        pfVar1 = (float *)(uVar23 + 0x20 + uVar27);
        auVar40._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
        auVar40._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
        auVar40._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
        auVar40._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
        auVar49 = maxps(auVar48,auVar40);
        pfVar2 = (float *)(uVar23 + 0x80 + (uVar26 ^ 0x10));
        pfVar1 = (float *)(uVar23 + 0x20 + (uVar26 ^ 0x10));
        auVar68._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar5) * fVar11;
        auVar68._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
        auVar68._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
        auVar68._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
        pfVar2 = (float *)(uVar23 + 0x80 + (uVar31 ^ 0x10));
        pfVar1 = (float *)(uVar23 + 0x20 + (uVar31 ^ 0x10));
        auVar41._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar6) * fVar12;
        auVar41._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar6) * fVar12;
        auVar41._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar6) * fVar12;
        auVar41._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar6) * fVar12;
        pfVar2 = (float *)(uVar23 + 0x80 + (uVar27 ^ 0x10));
        pfVar1 = (float *)(uVar23 + 0x20 + (uVar27 ^ 0x10));
        auVar57._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
        auVar57._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
        auVar57._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
        auVar57._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
        auVar42 = minps(auVar41,auVar57);
        auVar58._4_4_ = iVar14;
        auVar58._0_4_ = iVar14;
        auVar58._8_4_ = iVar14;
        auVar58._12_4_ = iVar14;
        auVar59 = maxps(auVar58,auVar34);
        auVar59 = maxps(auVar59,auVar49);
        auVar35._4_4_ = iVar15;
        auVar35._0_4_ = iVar15;
        auVar35._8_4_ = iVar15;
        auVar35._12_4_ = iVar15;
        auVar49 = minps(auVar35,auVar68);
        auVar49 = minps(auVar49,auVar42);
        if (uVar24 != 6) goto LAB_007226fb;
        bVar18 = auVar59._0_4_ <= auVar49._0_4_ &&
                 (fVar16 < *(float *)(uVar23 + 0xf0) && *(float *)(uVar23 + 0xe0) <= fVar16);
        bVar19 = auVar59._4_4_ <= auVar49._4_4_ &&
                 (fVar16 < *(float *)(uVar23 + 0xf4) && *(float *)(uVar23 + 0xe4) <= fVar16);
        bVar20 = auVar59._8_4_ <= auVar49._8_4_ &&
                 (fVar16 < *(float *)(uVar23 + 0xf8) && *(float *)(uVar23 + 0xe8) <= fVar16);
        bVar21 = auVar59._12_4_ <= auVar49._12_4_ &&
                 (fVar16 < *(float *)(uVar23 + 0xfc) && *(float *)(uVar23 + 0xec) <= fVar16);
      }
      auVar60._0_4_ = (uint)bVar18 * -0x80000000;
      auVar60._4_4_ = (uint)bVar19 * -0x80000000;
      auVar60._8_4_ = (uint)bVar20 * -0x80000000;
      auVar60._12_4_ = (uint)bVar21 * -0x80000000;
      uVar24 = movmskps(uVar24,auVar60);
      if (uVar24 == 0) goto LAB_007225d3;
      uVar24 = uVar24 & 0xff;
      lVar17 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
        }
      }
      uVar30 = *(ulong *)(uVar23 + lVar17 * 8);
      uVar24 = uVar24 - 1 & uVar24;
      uVar25 = (ulong)uVar24;
    } while (uVar24 == 0);
    do {
      *puVar29 = uVar30;
      puVar29 = puVar29 + 1;
      lVar17 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
        }
      }
      uVar30 = *(ulong *)(uVar23 + lVar17 * 8);
      uVar25 = uVar25 - 1 & uVar25;
    } while (uVar25 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }